

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pbVar2;
  pointer pcVar3;
  pointer ppcVar4;
  _Alloc_hider _Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var11;
  byte bVar12;
  long lVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  pointer ppcVar15;
  long lVar16;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  cmCTest *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  string_view varg1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  initializer_list<cmCTestGenericHandler_*> __l;
  bool SRArgumentSpecified;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> presetName;
  string arg;
  string errormsg;
  bool local_251;
  size_t local_250;
  cmCTest *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  string local_238;
  int local_214;
  ulong local_210;
  long *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  long local_1f8 [2];
  vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> local_1e8;
  long *local_1d0 [2];
  long local_1c0 [2];
  string *local_1b0;
  string local_1a8;
  cmCTestTestHandler *local_188;
  long lStack_180;
  cmCTestConfigureHandler *local_178;
  long lStack_170;
  cmCTestSubmitHandler *local_168;
  cmCTestUploadHandler *local_160;
  ios_base local_138 [264];
  
  local_251 = false;
  _Var11._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  local_248 = this;
  local_1b0 = output;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(_Var11._M_head_impl)->InitialCommandLineArguments,
             ((_Var11._M_head_impl)->InitialCommandLineArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
  __it._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[15]>>
                        ((args->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start,__it._M_current,"--list-presets"
                        );
  this_00 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = (long)pbVar1 - (long)this_00;
  if (0 < lVar13 >> 7) {
    lVar16 = (lVar13 >> 7) + 1;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
              ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                            *)this_00,__it);
      pbVar14 = local_240;
      pbVar17 = this_00;
      if (bVar6) goto LAB_001862a8;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
              ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                            *)(this_00 + 1),__it);
      pbVar14 = local_240;
      pbVar17 = this_00 + 1;
      if (bVar6) goto LAB_001862a8;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
              ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                            *)(this_00 + 2),__it);
      pbVar14 = local_240;
      pbVar17 = this_00 + 2;
      if (bVar6) goto LAB_001862a8;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
              ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                            *)(this_00 + 3),__it);
      pbVar14 = local_240;
      pbVar17 = this_00 + 3;
      if (bVar6) goto LAB_001862a8;
      this_00 = this_00 + 4;
      lVar16 = lVar16 + -1;
      lVar13 = lVar13 + -0x80;
    } while (1 < lVar16);
  }
  pbVar14 = local_240;
  lVar13 = lVar13 >> 5;
  if (lVar13 == 1) {
LAB_00186297:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
            ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                          *)this_00,__it);
    pbVar17 = this_00;
    if (!bVar6) {
      pbVar17 = pbVar1;
    }
  }
  else if (lVar13 == 2) {
LAB_00186280:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
            ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                          *)this_00,__it);
    pbVar17 = this_00;
    if (!bVar6) {
      this_00 = this_00 + 1;
      goto LAB_00186297;
    }
  }
  else {
    pbVar17 = pbVar1;
    if ((lVar13 == 3) &&
       (bVar6 = __gnu_cxx::__ops::
                _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
                ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                              *)this_00,__it), pbVar17 = this_00, !bVar6)) {
      this_00 = this_00 + 1;
      goto LAB_00186280;
    }
  }
LAB_001862a8:
  if (pbVar14 == pbVar1) {
    this_01 = local_248;
    if (pbVar17 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) goto LAB_00186411;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    local_1a8._M_string_length = 0;
    local_1a8.field_2._M_allocated_capacity =
         (ulong)(uint7)local_1a8.field_2._M_allocated_capacity._1_7_ << 8;
    local_238._M_string_length = (size_type)(pbVar17->_M_dataplus)._M_p;
    local_238._M_dataplus._M_p = (pointer)pbVar17->_M_string_length;
    __str._M_str = "--preset=";
    __str._M_len = 9;
    in_R8 = "--preset=";
    iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_238,0,9,__str);
    this_01 = local_248;
    if (iVar9 == 0) {
      std::__cxx11::string::substr((ulong)&local_238,(ulong)pbVar17);
      bVar6 = SetArgsFromPreset(this_01,&local_238,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
    }
    else {
      if (pbVar17 + 1 ==
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_238,"\'--preset\' requires an argument","");
        cmSystemTools::Error(&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                   local_238.field_2._M_local_buf[0]) + 1);
        }
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        goto LAB_0018631a;
      }
      pcVar3 = pbVar17[1]._M_dataplus._M_p;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,pcVar3,pcVar3 + pbVar17[1]._M_string_length);
      bVar6 = SetArgsFromPreset(local_248,&local_238,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      this_01 = local_248;
    }
  }
  else {
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    local_1a8._M_string_length = 0;
    local_1a8.field_2._M_allocated_capacity =
         (ulong)(uint7)local_1a8.field_2._M_allocated_capacity._1_7_ << 8;
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
    bVar6 = SetArgsFromPreset(local_248,&local_238,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,
                      CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                               local_238.field_2._M_local_buf[0]) + 1);
    }
    pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)!bVar6;
LAB_0018631a:
    bVar6 = false;
    this_01 = local_248;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,(ulong)(local_1a8.field_2._M_allocated_capacity + 1))
    ;
  }
  if (bVar6 == false) {
    return (int)pbVar14;
  }
  pbVar17 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
LAB_00186411:
  local_250 = 1;
  if ((ulong)((long)pbVar17 -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    bVar12 = 1;
    local_210 = 0;
  }
  else {
    local_214 = (int)pbVar14;
    bVar12 = 1;
    local_210 = 0;
    do {
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      local_238._M_string_length = 0;
      local_238.field_2._M_local_buf[0] = '\0';
      bVar6 = HandleCommandLineArguments(this_01,&local_250,args,&local_238);
      if (bVar6) {
        HandleScriptArguments(this_01,&local_250,args,&local_251);
        pbVar2 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_208 = local_1f8;
        pcVar3 = pbVar2[local_250]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,pcVar3,pcVar3 + pbVar2[local_250]._M_string_length);
        varg1._M_str = "--dashboard";
        varg1._M_len = (size_t)"-D";
        bVar6 = CheckArgument((cmCTest *)&local_208,(string *)0x2,varg1,in_R8);
        if ((bVar6) &&
           (pbVar2 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,
           local_250 <
           ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) - 1U)) {
          ((this_01->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
          local_250 = local_250 + 1;
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          pcVar3 = pbVar2[local_250]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,pcVar3,pcVar3 + pbVar2[local_250]._M_string_length);
          bVar6 = AddTestsForDashboardType(this_01,&local_1a8);
          if ((!bVar6) && (bVar6 = AddVariableDefinition(this_01,&local_1a8), !bVar6)) {
            ErrorMessageUnknownDashDValue(this_01,&local_1a8);
            bVar12 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
        }
        iVar9 = std::__cxx11::string::compare((char *)&local_208);
        if (iVar9 != 0) {
          local_1a8._M_dataplus._M_p = (pointer)local_200;
          local_1a8._M_string_length = (size_type)local_208;
          __str_00._M_str = "-D";
          __str_00._M_len = 2;
          in_R8 = "-D";
          iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_1a8,0,2,
                             __str_00);
          if (iVar9 == 0) {
            std::__cxx11::string::substr((ulong)&local_1a8,(ulong)&local_208);
            AddVariableDefinition(this_01,&local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,
                              (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
            }
          }
        }
        bVar6 = HandleTestActionArgument(this_01,"ctest",&local_250,args);
        local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT71(local_240._1_7_,bVar6);
        bVar7 = HandleTestModelArgument(this_01,"ctest",&local_250,args);
        if (local_200 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0xe) {
          if ((*(long *)((long)local_208 + 6) != 0x74696d6275732d61 ||
               *local_208 != 0x2d61727478652d2d) ||
             (((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U <= local_250))
          goto LAB_001867f6;
          ((this_01->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Submit","");
          SetTest(this_01,&local_1a8,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          local_250 = local_250 + 1;
          bVar8 = SubmitExtraFiles(this_01,(args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + local_250);
          bVar6 = false;
          if (bVar8) goto LAB_00186744;
          local_214 = 0;
        }
        else {
LAB_00186744:
          if (local_200 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&DAT_00000011) {
            auVar19[0] = -((char)*local_208 == '-');
            auVar19[1] = -(*(char *)((long)local_208 + 1) == '-');
            auVar19[2] = -(*(char *)((long)local_208 + 2) == 's');
            auVar19[3] = -(*(char *)((long)local_208 + 3) == 'c');
            auVar19[4] = -(*(char *)((long)local_208 + 4) == 'h');
            auVar19[5] = -(*(char *)((long)local_208 + 5) == 'e');
            auVar19[6] = -(*(char *)((long)local_208 + 6) == 'd');
            auVar19[7] = -(*(char *)((long)local_208 + 7) == 'u');
            auVar19[8] = -((char)local_208[1] == 'l');
            auVar19[9] = -(*(char *)((long)local_208 + 9) == 'e');
            auVar19[10] = -(*(char *)((long)local_208 + 10) == '-');
            auVar19[0xb] = -(*(char *)((long)local_208 + 0xb) == 'r');
            auVar19[0xc] = -(*(char *)((long)local_208 + 0xc) == 'a');
            auVar19[0xd] = -(*(char *)((long)local_208 + 0xd) == 'n');
            auVar19[0xe] = -(*(char *)((long)local_208 + 0xe) == 'd');
            auVar19[0xf] = -(*(char *)((long)local_208 + 0xf) == 'o');
            auVar21[0] = -((char)local_208[2] == 'm');
            auVar21[1] = 0xff;
            auVar21[2] = 0xff;
            auVar21[3] = 0xff;
            auVar21[4] = 0xff;
            auVar21[5] = 0xff;
            auVar21[6] = 0xff;
            auVar21[7] = 0xff;
            auVar21[8] = 0xff;
            auVar21[9] = 0xff;
            auVar21[10] = 0xff;
            auVar21[0xb] = 0xff;
            auVar21[0xc] = 0xff;
            auVar21[0xd] = 0xff;
            auVar21[0xe] = 0xff;
            auVar21[0xf] = 0xff;
            auVar21 = auVar21 & auVar19;
            if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff) {
              _Var11._M_head_impl =
                   (this_01->Impl)._M_t.
                   super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                   .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
              in_R8 = (char *)0x6;
              std::__cxx11::string::_M_replace
                        ((ulong)&(_Var11._M_head_impl)->ScheduleType,0,
                         (char *)((_Var11._M_head_impl)->ScheduleType)._M_string_length,0x73b796);
            }
          }
          else if ((local_200 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x10) &&
                  (auVar18[0] = -((char)*local_208 == '-'),
                  auVar18[1] = -(*(char *)((long)local_208 + 1) == '-'),
                  auVar18[2] = -(*(char *)((long)local_208 + 2) == 'b'),
                  auVar18[3] = -(*(char *)((long)local_208 + 3) == 'u'),
                  auVar18[4] = -(*(char *)((long)local_208 + 4) == 'i'),
                  auVar18[5] = -(*(char *)((long)local_208 + 5) == 'l'),
                  auVar18[6] = -(*(char *)((long)local_208 + 6) == 'd'),
                  auVar18[7] = -(*(char *)((long)local_208 + 7) == '-'),
                  auVar18[8] = -((char)local_208[1] == 'a'),
                  auVar18[9] = -(*(char *)((long)local_208 + 9) == 'n'),
                  auVar18[10] = -(*(char *)((long)local_208 + 10) == 'd'),
                  auVar18[0xb] = -(*(char *)((long)local_208 + 0xb) == '-'),
                  auVar18[0xc] = -(*(char *)((long)local_208 + 0xc) == 't'),
                  auVar18[0xd] = -(*(char *)((long)local_208 + 0xd) == 'e'),
                  auVar18[0xe] = -(*(char *)((long)local_208 + 0xe) == 's'),
                  auVar18[0xf] = -(*(char *)((long)local_208 + 0xf) == 't'),
                  (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar18[0xf] >> 7) << 0xf) == 0xffff)) {
            local_210 = CONCAT71((int7)(local_210 >> 8),
                                 (byte)local_210 |
                                 local_250 <
                                 ((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U);
          }
LAB_001867f6:
          _Var11._M_head_impl =
               (this_01->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          auVar20._8_4_ = (int)_Var11._M_head_impl;
          auVar20._0_8_ = _Var11._M_head_impl;
          auVar20._12_4_ = (int)((ulong)_Var11._M_head_impl >> 0x20);
          lStack_170 = auVar20._8_8_;
          local_1a8._M_dataplus._M_p = (pointer)&(_Var11._M_head_impl)->BuildHandler;
          local_1a8._M_string_length = lStack_170 + 0x4b0;
          local_1a8.field_2._M_allocated_capacity =
               (size_type)&(_Var11._M_head_impl)->CoverageHandler;
          local_1a8.field_2._8_8_ = lStack_170 + 0x9f8;
          local_188 = &(_Var11._M_head_impl)->TestHandler;
          lStack_180 = lStack_170 + 0x15c8;
          local_178 = &(_Var11._M_head_impl)->ConfigureHandler;
          lStack_170 = lStack_170 + 0x1830;
          local_168 = &(_Var11._M_head_impl)->SubmitHandler;
          local_160 = &(_Var11._M_head_impl)->UploadHandler;
          __l._M_len = 10;
          __l._M_array = (iterator)&local_1a8;
          std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::vector
                    (&local_1e8,__l,(allocator_type *)local_1d0);
          ppcVar4 = local_1e8.
                    super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ppcVar15 = local_1e8.
                     super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          if (local_1e8.
              super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              local_1e8.
              super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            bVar6 = true;
            this_01 = local_248;
          }
          else {
            do {
              iVar9 = (*(*ppcVar15)->_vptr_cmCTestGenericHandler[2])
                                (*ppcVar15,(string *)&local_208,&local_250,args);
              bVar6 = iVar9 != 0;
              if (iVar9 == 0) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_1a8,
                           "Problem parsing command line arguments within a handler",0x37);
                this_01 = local_248;
                std::__cxx11::stringbuf::str();
                in_R8 = (char *)local_1d0[0];
                Log(this_01,7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                    ,0xaca,(char *)local_1d0[0],false);
                if (local_1d0[0] != local_1c0) {
                  operator_delete(local_1d0[0],local_1c0[0] + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
                std::ios_base::~ios_base(local_138);
                local_214 = 0;
                break;
              }
              ppcVar15 = ppcVar15 + 1;
              this_01 = local_248;
            } while (ppcVar15 != ppcVar4);
          }
          if (local_1e8.
              super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1e8.
                            super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1e8.
                                  super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1e8.
                                  super__Vector_base<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_208 != local_1f8) {
          operator_delete(local_208,local_1f8[0] + 1);
        }
        bVar12 = bVar12 & (byte)local_240 & bVar7;
      }
      else {
        cmSystemTools::Error(&local_238);
        local_214 = 1;
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar6) {
        return local_214;
      }
      local_250 = local_250 + 1;
    } while (local_250 <
             (ulong)((long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  _Var11._M_head_impl =
       (this_01->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if ((_Var11._M_head_impl)->ParallelLevelSetInCli == false) {
    local_1a8._M_string_length = 0;
    local_1a8.field_2._M_allocated_capacity =
         local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    bVar6 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",&local_1a8);
    _Var5._M_p = local_1a8._M_dataplus._M_p;
    if (bVar6) {
      iVar10 = atoi(local_1a8._M_dataplus._M_p);
      iVar9 = 1;
      if (1 < iVar10) {
        iVar9 = iVar10;
      }
      ((this_01->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ParallelLevel = iVar9;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != &local_1a8.field_2) {
      operator_delete(_Var5._M_p,(ulong)(local_1a8.field_2._M_allocated_capacity + 1));
    }
    _Var11._M_head_impl =
         (this_01->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  }
  if (((_Var11._M_head_impl)->TestProgressOutput == true) &&
     ((_Head_base<0UL,_cmGeneratedFileStream_*,_false>)
      *(_Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_> *)
       &((_Var11._M_head_impl)->OutputLogFile)._M_t.
        super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> ==
      (cmGeneratedFileStream *)0x0)) {
    bVar6 = ConsoleIsNotDumb();
    _Var11._M_head_impl =
         (this_01->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  }
  else {
    bVar6 = false;
  }
  (_Var11._M_head_impl)->TestProgressOutput = bVar6;
  if ((local_210 & 1) == 0) {
    iVar9 = 1;
    if (bVar12 != 0) {
      iVar9 = ExecuteTests(this_01);
    }
  }
  else {
    iVar9 = RunCMakeAndTest(this_01,local_1b0);
  }
  return iVar9;
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  cm::append(this->Impl->InitialCommandLineArguments, args);

  // check if a test preset was specified

  bool listPresets =
    find(args.begin(), args.end(), "--list-presets") != args.end();
  auto it =
    std::find_if(args.begin(), args.end(), [](std::string const& arg) -> bool {
      return arg == "--preset" || cmHasLiteralPrefix(arg, "--preset=");
    });
  if (listPresets || it != args.end()) {
    std::string errormsg;
    bool success;

    if (listPresets) {
      // If listing presets we don't need a presetName
      success = this->SetArgsFromPreset("", listPresets);
    } else {
      if (cmHasLiteralPrefix(*it, "--preset=")) {
        auto presetName = it->substr(9);
        success = this->SetArgsFromPreset(presetName, listPresets);
      } else if (++it != args.end()) {
        auto presetName = *it;
        success = this->SetArgsFromPreset(presetName, listPresets);
      } else {
        cmSystemTools::Error("'--preset' requires an argument");
        success = false;
      }
    }

    if (listPresets) {
      return success ? 0 : 1;
    }

    if (!success) {
      return 1;
    }
  }

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg);
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D"_s, "--dashboard") &&
        i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmHasLiteralPrefix(arg, "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit"_s) && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i])) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test"_s) &&
        i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random"_s)) {
      this->Impl->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but it may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      if (!handler->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->Impl->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // TestProgressOutput only supported if console supports it and not logging
  // to a file
  this->Impl->TestProgressOutput = this->Impl->TestProgressOutput &&
    !this->Impl->OutputLogFile && this->ProgressOutputSupportedByConsole();
#ifdef _WIN32
  if (this->Impl->TestProgressOutput) {
    // Disable output line buffering so we can print content without
    // a newline.
    std::setvbuf(stdout, nullptr, _IONBF, 0);
  }
#endif

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}